

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O3

void __thiscall QNetworkCacheMetaData::setSaveToDisk(QNetworkCacheMetaData *this,bool allow)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QNetworkCacheMetaDataPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->saveToDisk = allow;
  return;
}

Assistant:

void QNetworkCacheMetaData::setSaveToDisk(bool allow)
{
    d->saveToDisk = allow;
}